

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse42::BVHNIntersector1<4,_257,_false,_embree::sse42::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  ulong uVar3;
  undefined8 uVar4;
  long lVar5;
  int iVar6;
  undefined1 (*pauVar7) [16];
  int iVar8;
  undefined4 uVar9;
  ulong uVar10;
  ulong uVar11;
  RayQueryContext *extraout_RDX;
  ulong uVar12;
  ulong uVar13;
  undefined1 (*pauVar14) [16];
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  uint uVar21;
  float fVar38;
  float fVar41;
  vint4 ai;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar39;
  uint uVar40;
  float fVar42;
  uint uVar43;
  float fVar44;
  uint uVar45;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 bi_2;
  float fVar46;
  uint uVar47;
  float fVar48;
  float fVar51;
  float fVar54;
  vint4 ai_1;
  uint uVar52;
  float fVar53;
  uint uVar55;
  float fVar56;
  float fVar57;
  uint uVar58;
  float fVar59;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar60;
  float fVar64;
  float fVar65;
  vfloat4 a0;
  undefined1 auVar61 [16];
  float fVar66;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar67;
  uint uVar68;
  float fVar69;
  float fVar72;
  float fVar75;
  vint4 ai_3;
  uint uVar73;
  float fVar74;
  uint uVar76;
  float fVar77;
  float fVar78;
  uint uVar79;
  float fVar80;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  float fVar91;
  float fVar92;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  vint4 bi;
  undefined1 auVar94 [16];
  float fVar95;
  float fVar98;
  float fVar99;
  vint4 bi_7;
  undefined1 auVar96 [16];
  float fVar100;
  undefined1 auVar97 [16];
  vint4 bi_4;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1098 [16];
  ulong local_1088;
  RayHit *local_1080;
  Intersectors *local_1078;
  RayQueryContext *local_1070;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1070 = context;
  local_1078 = This;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_fe8 = aVar2.x;
    local_ff8 = aVar2.y;
    local_fd8 = aVar2.z;
    auVar22 = dpps((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar61 = rsqrtss(auVar22,auVar22);
    fVar18 = auVar61._0_4_;
    local_fb8[0] = fVar18 * 1.5 - fVar18 * fVar18 * auVar22._0_4_ * 0.5 * fVar18;
    auVar83._0_4_ = local_fe8 * local_fb8[0];
    auVar83._4_4_ = local_ff8 * local_fb8[0];
    auVar83._8_4_ = local_fd8 * local_fb8[0];
    auVar83._12_4_ = aVar2.field_3.w * local_fb8[0];
    uVar13 = CONCAT44(auVar83._4_4_,auVar83._4_4_);
    auVar23._0_8_ = uVar13 ^ 0x8000000080000000;
    auVar23._8_4_ = -auVar83._12_4_;
    auVar23._12_4_ = -auVar83._12_4_;
    auVar90._0_12_ = ZEXT812(0);
    auVar90._12_4_ = 0;
    auVar23 = blendps(auVar23,auVar90,0xe);
    auVar22._4_4_ = auVar23._0_4_;
    auVar22._0_4_ = auVar83._8_4_;
    auVar22._8_4_ = auVar23._4_4_;
    auVar22._12_4_ = 0;
    auVar61._4_4_ = auVar23._0_4_;
    auVar61._0_4_ = auVar83._8_4_;
    auVar61._8_4_ = auVar23._4_4_;
    auVar61._12_4_ = 0;
    auVar94 = dpps(auVar61 << 0x20,auVar22 << 0x20,0x7f);
    uVar13 = CONCAT44(auVar83._12_4_,auVar83._8_4_);
    auVar85._0_8_ = uVar13 ^ 0x8000000080000000;
    auVar85._8_4_ = -auVar83._8_4_;
    auVar85._12_4_ = -auVar83._12_4_;
    auVar23 = insertps(auVar85,auVar83,0x2a);
    auVar61 = dpps(auVar23,auVar23,0x7f);
    iVar17 = -(uint)(auVar61._0_4_ < auVar94._0_4_);
    auVar94._4_4_ = iVar17;
    auVar94._0_4_ = iVar17;
    auVar94._8_4_ = iVar17;
    auVar94._12_4_ = iVar17;
    auVar22 = blendvps(auVar23,auVar22 << 0x20,auVar94);
    auVar61 = dpps(auVar22,auVar22,0x7f);
    auVar23 = rsqrtss(auVar61,auVar61);
    fVar18 = auVar23._0_4_;
    fVar18 = fVar18 * 1.5 - fVar18 * fVar18 * auVar61._0_4_ * 0.5 * fVar18;
    fVar19 = fVar18 * auVar22._0_4_;
    fVar38 = fVar18 * auVar22._4_4_;
    fVar41 = fVar18 * auVar22._8_4_;
    fVar18 = fVar18 * auVar22._12_4_;
    fVar84 = fVar38 * auVar83._0_4_ - auVar83._4_4_ * fVar19;
    fVar91 = fVar41 * auVar83._4_4_ - auVar83._8_4_ * fVar38;
    fVar92 = fVar19 * auVar83._8_4_ - auVar83._0_4_ * fVar41;
    auVar86._12_4_ = fVar18 * auVar83._12_4_ - auVar83._12_4_ * fVar18;
    auVar86._0_8_ = CONCAT44(fVar92,fVar91);
    auVar86._8_4_ = fVar84;
    auVar93._8_4_ = fVar84;
    auVar93._0_8_ = auVar86._0_8_;
    auVar93._12_4_ = auVar86._12_4_;
    auVar22 = dpps(auVar93,auVar86,0x7f);
    auVar61 = rsqrtss(auVar22,auVar22);
    fVar18 = auVar61._0_4_;
    fVar18 = fVar18 * 1.5 - fVar18 * fVar18 * auVar22._0_4_ * 0.5 * fVar18;
    local_f88._4_4_ = fVar18 * fVar84;
    local_f88._0_4_ = fVar41;
    local_f88._8_4_ = auVar83._8_4_ * local_fb8[0];
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar18 * fVar92;
    local_f98._0_4_ = fVar38;
    local_f98._8_4_ = auVar83._4_4_ * local_fb8[0];
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar18 * fVar91;
    local_fa8._0_4_ = fVar19;
    local_fa8._8_4_ = auVar83._0_4_ * local_fb8[0];
    local_fa8._12_4_ = 0;
    pauVar14 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    local_1038 = (ray->super_RayK<1>).org.field_0.m128[0];
    local_1048 = (ray->super_RayK<1>).org.field_0.m128[1];
    local_fc8 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar19 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    fVar18 = 0.0;
    if (0.0 <= fVar19) {
      fVar18 = fVar19;
    }
    fVar19 = (ray->super_RayK<1>).tfar;
    fVar38 = 0.0;
    if (0.0 <= fVar19) {
      fVar38 = fVar19;
    }
    auVar24._4_4_ = -(uint)(ABS(local_ff8) < DAT_01f4bd50._4_4_);
    auVar24._0_4_ = -(uint)(ABS(local_fe8) < (float)DAT_01f4bd50);
    auVar24._8_4_ = -(uint)(ABS(local_fd8) < DAT_01f4bd50._8_4_);
    auVar24._12_4_ = -(uint)(ABS(aVar2.field_3.w) < DAT_01f4bd50._12_4_);
    auVar61 = blendvps((undefined1  [16])aVar2,_DAT_01f4bd50,auVar24);
    auVar22 = rcpps(auVar24,auVar61);
    local_1058 = auVar22._0_4_;
    local_1068 = auVar22._4_4_;
    local_1028 = auVar22._8_4_;
    local_1058 = (1.0 - auVar61._0_4_ * local_1058) * local_1058 + local_1058;
    local_1068 = (1.0 - auVar61._4_4_ * local_1068) * local_1068 + local_1068;
    local_1028 = (1.0 - auVar61._8_4_ * local_1028) * local_1028 + local_1028;
    fStack_fe4 = local_fe8;
    fStack_fe0 = local_fe8;
    fStack_fdc = local_fe8;
    fStack_ff4 = local_ff8;
    fStack_ff0 = local_ff8;
    fStack_fec = local_ff8;
    fStack_fd4 = local_fd8;
    fStack_fd0 = local_fd8;
    fStack_fcc = local_fd8;
    uVar12 = (ulong)(local_1058 < 0.0) << 4;
    uVar15 = (ulong)(local_1068 < 0.0) << 4 | 0x20;
    uVar16 = (ulong)(local_1028 < 0.0) << 4 | 0x40;
    local_1018._4_4_ = fVar18;
    local_1018._0_4_ = fVar18;
    local_1018._8_4_ = fVar18;
    local_1018._12_4_ = fVar18;
    local_1080 = ray;
    fStack_fc4 = local_fc8;
    fStack_fc0 = local_fc8;
    fStack_fbc = local_fc8;
    fStack_1024 = local_1028;
    fStack_1020 = local_1028;
    fStack_101c = local_1028;
    fStack_1034 = local_1038;
    fStack_1030 = local_1038;
    fStack_102c = local_1038;
    fStack_1044 = local_1048;
    fStack_1040 = local_1048;
    fStack_103c = local_1048;
    local_1088 = uVar12;
    fStack_1054 = local_1058;
    fStack_1050 = local_1058;
    fStack_104c = local_1058;
    fStack_1064 = local_1068;
    fStack_1060 = local_1068;
    fStack_105c = local_1068;
    uVar13 = uVar12;
    fVar18 = fVar38;
    fVar19 = fVar38;
    fVar41 = fVar38;
    auVar22 = local_1018;
    fVar84 = local_1058;
    fVar91 = local_1058;
    fVar92 = local_1058;
    fVar104 = local_1058;
    fVar48 = local_1028;
    fVar53 = local_1028;
    fVar56 = local_1028;
    fVar59 = local_1028;
    fVar105 = local_fc8;
    fVar106 = local_fc8;
    fVar107 = local_fc8;
    fVar108 = local_fc8;
    fVar60 = local_1048;
    fVar64 = local_1048;
    fVar65 = local_1048;
    fVar66 = local_1048;
    fVar69 = local_1038;
    fVar74 = local_1038;
    fVar77 = local_1038;
    fVar80 = local_1038;
    fVar95 = local_1068;
    fVar98 = local_1068;
    fVar99 = local_1068;
    fVar100 = local_1068;
LAB_0067a608:
    if (pauVar14 != (undefined1 (*) [16])&local_f78) {
      pauVar7 = pauVar14 + -1;
      pauVar14 = pauVar14 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar7 + 8) < *pfVar1 || *(float *)((long)*pauVar7 + 8) == *pfVar1) {
        uVar10 = *(ulong *)*pauVar14;
LAB_0067a62d:
        iVar8 = (int)(uVar10 & 0xf);
        iVar17 = auVar22._12_4_;
        if ((uVar10 & 0xf) == 0) {
          pfVar1 = (float *)(uVar10 + 0x20 + uVar13);
          fVar20 = (*pfVar1 - fVar69) * fVar84;
          fVar39 = (pfVar1[1] - fVar74) * fVar91;
          fVar42 = (pfVar1[2] - fVar77) * fVar92;
          fVar44 = (pfVar1[3] - fVar80) * fVar104;
          pfVar1 = (float *)(uVar10 + 0x20 + uVar15);
          fVar46 = (*pfVar1 - fVar60) * fVar95;
          fVar51 = (pfVar1[1] - fVar64) * fVar98;
          fVar54 = (pfVar1[2] - fVar65) * fVar99;
          fVar57 = (pfVar1[3] - fVar66) * fVar100;
          uVar47 = (uint)((int)fVar46 < (int)fVar20) * (int)fVar20 |
                   (uint)((int)fVar46 >= (int)fVar20) * (int)fVar46;
          uVar52 = (uint)((int)fVar51 < (int)fVar39) * (int)fVar39 |
                   (uint)((int)fVar51 >= (int)fVar39) * (int)fVar51;
          uVar55 = (uint)((int)fVar54 < (int)fVar42) * (int)fVar42 |
                   (uint)((int)fVar54 >= (int)fVar42) * (int)fVar54;
          uVar58 = (uint)((int)fVar57 < (int)fVar44) * (int)fVar44 |
                   (uint)((int)fVar57 >= (int)fVar44) * (int)fVar57;
          pfVar1 = (float *)(uVar10 + 0x20 + uVar16);
          fVar20 = (*pfVar1 - fVar105) * fVar48;
          fVar39 = (pfVar1[1] - fVar106) * fVar53;
          fVar42 = (pfVar1[2] - fVar107) * fVar56;
          fVar44 = (pfVar1[3] - fVar108) * fVar59;
          pfVar1 = (float *)(uVar10 + 0x20 + (uVar12 ^ 0x10));
          fVar46 = (*pfVar1 - fVar69) * fVar84;
          fVar51 = (pfVar1[1] - fVar74) * fVar91;
          fVar54 = (pfVar1[2] - fVar77) * fVar92;
          fVar57 = (pfVar1[3] - fVar80) * fVar104;
          pfVar1 = (float *)(uVar10 + 0x20 + (uVar15 ^ 0x10));
          fVar67 = (*pfVar1 - fVar60) * fVar95;
          fVar72 = (pfVar1[1] - fVar64) * fVar98;
          fVar75 = (pfVar1[2] - fVar65) * fVar99;
          fVar78 = (pfVar1[3] - fVar66) * fVar100;
          uVar68 = (uint)((int)fVar46 < (int)fVar67) * (int)fVar46 |
                   (uint)((int)fVar46 >= (int)fVar67) * (int)fVar67;
          uVar73 = (uint)((int)fVar51 < (int)fVar72) * (int)fVar51 |
                   (uint)((int)fVar51 >= (int)fVar72) * (int)fVar72;
          uVar76 = (uint)((int)fVar54 < (int)fVar75) * (int)fVar54 |
                   (uint)((int)fVar54 >= (int)fVar75) * (int)fVar75;
          uVar79 = (uint)((int)fVar57 < (int)fVar78) * (int)fVar57 |
                   (uint)((int)fVar57 >= (int)fVar78) * (int)fVar78;
          pfVar1 = (float *)(uVar10 + 0x20 + (uVar16 ^ 0x10));
          fVar46 = (*pfVar1 - fVar105) * fVar48;
          fVar51 = (pfVar1[1] - fVar106) * fVar53;
          fVar54 = (pfVar1[2] - fVar107) * fVar56;
          fVar57 = (pfVar1[3] - fVar108) * fVar59;
          iVar6 = auVar22._0_4_;
          uVar21 = (uint)((int)fVar20 < iVar6) * iVar6 | (uint)((int)fVar20 >= iVar6) * (int)fVar20;
          iVar6 = auVar22._4_4_;
          uVar40 = (uint)((int)fVar39 < iVar6) * iVar6 | (uint)((int)fVar39 >= iVar6) * (int)fVar39;
          iVar6 = auVar22._8_4_;
          uVar43 = (uint)((int)fVar42 < iVar6) * iVar6 | (uint)((int)fVar42 >= iVar6) * (int)fVar42;
          uVar45 = (uint)((int)fVar44 < iVar17) * iVar17 |
                   (uint)((int)fVar44 >= iVar17) * (int)fVar44;
          local_1098._0_4_ =
               ((int)uVar21 < (int)uVar47) * uVar47 | ((int)uVar21 >= (int)uVar47) * uVar21;
          local_1098._4_4_ =
               ((int)uVar40 < (int)uVar52) * uVar52 | ((int)uVar40 >= (int)uVar52) * uVar40;
          local_1098._8_4_ =
               ((int)uVar43 < (int)uVar55) * uVar55 | ((int)uVar43 >= (int)uVar55) * uVar43;
          local_1098._12_4_ =
               ((int)uVar45 < (int)uVar58) * uVar58 | ((int)uVar45 >= (int)uVar58) * uVar45;
          uVar21 = (uint)((int)fVar38 < (int)fVar46) * (int)fVar38 |
                   (uint)((int)fVar38 >= (int)fVar46) * (int)fVar46;
          uVar40 = (uint)((int)fVar18 < (int)fVar51) * (int)fVar18 |
                   (uint)((int)fVar18 >= (int)fVar51) * (int)fVar51;
          uVar43 = (uint)((int)fVar19 < (int)fVar54) * (int)fVar19 |
                   (uint)((int)fVar19 >= (int)fVar54) * (int)fVar54;
          uVar45 = (uint)((int)fVar41 < (int)fVar57) * (int)fVar41 |
                   (uint)((int)fVar41 >= (int)fVar57) * (int)fVar57;
          auVar25._0_4_ =
               -(uint)((int)(((int)uVar68 < (int)uVar21) * uVar68 |
                            ((int)uVar68 >= (int)uVar21) * uVar21) < (int)local_1098._0_4_);
          auVar25._4_4_ =
               -(uint)((int)(((int)uVar73 < (int)uVar40) * uVar73 |
                            ((int)uVar73 >= (int)uVar40) * uVar40) < (int)local_1098._4_4_);
          auVar25._8_4_ =
               -(uint)((int)(((int)uVar76 < (int)uVar43) * uVar76 |
                            ((int)uVar76 >= (int)uVar43) * uVar43) < (int)local_1098._8_4_);
          auVar25._12_4_ =
               -(uint)((int)(((int)uVar79 < (int)uVar45) * uVar79 |
                            ((int)uVar79 >= (int)uVar45) * uVar45) < (int)local_1098._12_4_);
          uVar9 = movmskps(iVar8,auVar25);
          context = (RayQueryContext *)(ulong)(byte)((byte)uVar9 ^ 0xf);
        }
        else {
          if (iVar8 != 2) {
            (**(code **)((long)local_1078->leafIntersector +
                        (ulong)*(byte *)(uVar10 & 0xfffffffffffffff0) * 0x40))
                      (local_fb8,ray,local_1070);
            fVar38 = (local_1080->super_RayK<1>).tfar;
            context = extraout_RDX;
            ray = local_1080;
            uVar13 = local_1088;
            fVar18 = fVar38;
            fVar19 = fVar38;
            fVar41 = fVar38;
            auVar22 = local_1018;
            fVar84 = local_1058;
            fVar91 = fStack_1054;
            fVar92 = fStack_1050;
            fVar104 = fStack_104c;
            fVar48 = local_1028;
            fVar53 = fStack_1024;
            fVar56 = fStack_1020;
            fVar59 = fStack_101c;
            fVar105 = local_fc8;
            fVar106 = fStack_fc4;
            fVar107 = fStack_fc0;
            fVar108 = fStack_fbc;
            fVar60 = local_1048;
            fVar64 = fStack_1044;
            fVar65 = fStack_1040;
            fVar66 = fStack_103c;
            fVar69 = local_1038;
            fVar74 = fStack_1034;
            fVar77 = fStack_1030;
            fVar80 = fStack_102c;
            fVar95 = local_1068;
            fVar98 = fStack_1064;
            fVar99 = fStack_1060;
            fVar100 = fStack_105c;
            goto LAB_0067a608;
          }
          uVar11 = uVar10 & 0xfffffffffffffff0;
          local_1008 = *(float *)(uVar11 + 0x70);
          fStack_1004 = *(float *)(uVar11 + 0x74);
          fStack_1000 = *(float *)(uVar11 + 0x78);
          fStack_ffc = *(float *)(uVar11 + 0x7c);
          auVar96._0_4_ =
               local_fe8 * *(float *)(uVar11 + 0x20) +
               local_ff8 * *(float *)(uVar11 + 0x50) + local_fd8 * *(float *)(uVar11 + 0x80);
          auVar96._4_4_ =
               fStack_fe4 * *(float *)(uVar11 + 0x24) +
               fStack_ff4 * *(float *)(uVar11 + 0x54) + fStack_fd4 * *(float *)(uVar11 + 0x84);
          auVar96._8_4_ =
               fStack_fe0 * *(float *)(uVar11 + 0x28) +
               fStack_ff0 * *(float *)(uVar11 + 0x58) + fStack_fd0 * *(float *)(uVar11 + 0x88);
          auVar96._12_4_ =
               fStack_fdc * *(float *)(uVar11 + 0x2c) +
               fStack_fec * *(float *)(uVar11 + 0x5c) + fStack_fcc * *(float *)(uVar11 + 0x8c);
          auVar101._0_4_ =
               local_fe8 * *(float *)(uVar11 + 0x30) +
               local_ff8 * *(float *)(uVar11 + 0x60) + local_fd8 * *(float *)(uVar11 + 0x90);
          auVar101._4_4_ =
               fStack_fe4 * *(float *)(uVar11 + 0x34) +
               fStack_ff4 * *(float *)(uVar11 + 100) + fStack_fd4 * *(float *)(uVar11 + 0x94);
          auVar101._8_4_ =
               fStack_fe0 * *(float *)(uVar11 + 0x38) +
               fStack_ff0 * *(float *)(uVar11 + 0x68) + fStack_fd0 * *(float *)(uVar11 + 0x98);
          auVar101._12_4_ =
               fStack_fdc * *(float *)(uVar11 + 0x3c) +
               fStack_fec * *(float *)(uVar11 + 0x6c) + fStack_fcc * *(float *)(uVar11 + 0x9c);
          auVar103._0_4_ =
               local_fe8 * *(float *)(uVar11 + 0x40) +
               local_ff8 * local_1008 + local_fd8 * *(float *)(uVar11 + 0xa0);
          auVar103._4_4_ =
               fStack_fe4 * *(float *)(uVar11 + 0x44) +
               fStack_ff4 * fStack_1004 + fStack_fd4 * *(float *)(uVar11 + 0xa4);
          auVar103._8_4_ =
               fStack_fe0 * *(float *)(uVar11 + 0x48) +
               fStack_ff0 * fStack_1000 + fStack_fd0 * *(float *)(uVar11 + 0xa8);
          auVar103._12_4_ =
               fStack_fdc * *(float *)(uVar11 + 0x4c) +
               fStack_fec * fStack_ffc + fStack_fcc * *(float *)(uVar11 + 0xac);
          fVar84 = (float)DAT_01f4bd50;
          fVar91 = DAT_01f4bd50._4_4_;
          fVar92 = DAT_01f4bd50._8_4_;
          fVar104 = DAT_01f4bd50._12_4_;
          auVar26._4_4_ = -(uint)(ABS(auVar96._4_4_) < fVar91);
          auVar26._0_4_ = -(uint)(ABS(auVar96._0_4_) < fVar84);
          auVar26._8_4_ = -(uint)(ABS(auVar96._8_4_) < fVar92);
          auVar26._12_4_ = -(uint)(ABS(auVar96._12_4_) < fVar104);
          auVar22 = blendvps(auVar96,_DAT_01f4bd50,auVar26);
          auVar27._4_4_ = -(uint)(ABS(auVar101._4_4_) < fVar91);
          auVar27._0_4_ = -(uint)(ABS(auVar101._0_4_) < fVar84);
          auVar27._8_4_ = -(uint)(ABS(auVar101._8_4_) < fVar92);
          auVar27._12_4_ = -(uint)(ABS(auVar101._12_4_) < fVar104);
          auVar61 = blendvps(auVar101,_DAT_01f4bd50,auVar27);
          auVar28._4_4_ = -(uint)(ABS(auVar103._4_4_) < fVar91);
          auVar28._0_4_ = -(uint)(ABS(auVar103._0_4_) < fVar84);
          auVar28._8_4_ = -(uint)(ABS(auVar103._8_4_) < fVar92);
          auVar28._12_4_ = -(uint)(ABS(auVar103._12_4_) < fVar104);
          auVar23 = blendvps(auVar103,_DAT_01f4bd50,auVar28);
          auVar94 = rcpps(_DAT_01f4bd50,auVar22);
          fVar84 = auVar94._0_4_;
          fVar91 = auVar94._4_4_;
          fVar92 = auVar94._8_4_;
          fVar104 = auVar94._12_4_;
          fVar84 = (1.0 - auVar22._0_4_ * fVar84) * fVar84 + fVar84;
          fVar91 = (1.0 - auVar22._4_4_ * fVar91) * fVar91 + fVar91;
          fVar92 = (1.0 - auVar22._8_4_ * fVar92) * fVar92 + fVar92;
          fVar104 = (1.0 - auVar22._12_4_ * fVar104) * fVar104 + fVar104;
          auVar22 = rcpps(auVar94,auVar61);
          fVar95 = auVar22._0_4_;
          fVar98 = auVar22._4_4_;
          fVar99 = auVar22._8_4_;
          fVar100 = auVar22._12_4_;
          fVar95 = (1.0 - auVar61._0_4_ * fVar95) * fVar95 + fVar95;
          fVar98 = (1.0 - auVar61._4_4_ * fVar98) * fVar98 + fVar98;
          fVar99 = (1.0 - auVar61._8_4_ * fVar99) * fVar99 + fVar99;
          fVar100 = (1.0 - auVar61._12_4_ * fVar100) * fVar100 + fVar100;
          auVar22 = rcpps(auVar22,auVar23);
          fVar20 = auVar22._0_4_;
          fVar39 = auVar22._4_4_;
          fVar42 = auVar22._8_4_;
          fVar44 = auVar22._12_4_;
          fVar20 = (1.0 - auVar23._0_4_ * fVar20) * fVar20 + fVar20;
          fVar39 = (1.0 - auVar23._4_4_ * fVar39) * fVar39 + fVar39;
          fVar42 = (1.0 - auVar23._8_4_ * fVar42) * fVar42 + fVar42;
          fVar44 = (1.0 - auVar23._12_4_ * fVar44) * fVar44 + fVar44;
          fVar69 = (*(float *)(uVar11 + 0x20) * local_1038 +
                   *(float *)(uVar11 + 0x50) * local_1048 +
                   *(float *)(uVar11 + 0x80) * fVar105 + *(float *)(uVar11 + 0xb0)) * -fVar84;
          fVar74 = (*(float *)(uVar11 + 0x24) * fStack_1034 +
                   *(float *)(uVar11 + 0x54) * fStack_1044 +
                   *(float *)(uVar11 + 0x84) * fVar106 + *(float *)(uVar11 + 0xb4)) * -fVar91;
          fVar77 = (*(float *)(uVar11 + 0x28) * fStack_1030 +
                   *(float *)(uVar11 + 0x58) * fStack_1040 +
                   *(float *)(uVar11 + 0x88) * fVar107 + *(float *)(uVar11 + 0xb8)) * -fVar92;
          fVar80 = (*(float *)(uVar11 + 0x2c) * fStack_102c +
                   *(float *)(uVar11 + 0x5c) * fStack_103c +
                   *(float *)(uVar11 + 0x8c) * fVar108 + *(float *)(uVar11 + 0xbc)) * -fVar104;
          fVar60 = (*(float *)(uVar11 + 0x30) * local_1038 +
                   *(float *)(uVar11 + 0x60) * local_1048 +
                   *(float *)(uVar11 + 0x90) * fVar105 + *(float *)(uVar11 + 0xc0)) * -fVar95;
          fVar64 = (*(float *)(uVar11 + 0x34) * fStack_1034 +
                   *(float *)(uVar11 + 100) * fStack_1044 +
                   *(float *)(uVar11 + 0x94) * fVar106 + *(float *)(uVar11 + 0xc4)) * -fVar98;
          fVar65 = (*(float *)(uVar11 + 0x38) * fStack_1030 +
                   *(float *)(uVar11 + 0x68) * fStack_1040 +
                   *(float *)(uVar11 + 0x98) * fVar107 + *(float *)(uVar11 + 200)) * -fVar99;
          fVar66 = (*(float *)(uVar11 + 0x3c) * fStack_102c +
                   *(float *)(uVar11 + 0x6c) * fStack_103c +
                   *(float *)(uVar11 + 0x9c) * fVar108 + *(float *)(uVar11 + 0xcc)) * -fVar100;
          fVar48 = (*(float *)(uVar11 + 0x40) * local_1038 +
                   local_1008 * local_1048 +
                   *(float *)(uVar11 + 0xa0) * fVar105 + *(float *)(uVar11 + 0xd0)) * -fVar20;
          fVar53 = (*(float *)(uVar11 + 0x44) * fStack_1034 +
                   fStack_1004 * fStack_1044 +
                   *(float *)(uVar11 + 0xa4) * fVar106 + *(float *)(uVar11 + 0xd4)) * -fVar39;
          fVar56 = (*(float *)(uVar11 + 0x48) * fStack_1030 +
                   fStack_1000 * fStack_1040 +
                   *(float *)(uVar11 + 0xa8) * fVar107 + *(float *)(uVar11 + 0xd8)) * -fVar42;
          fVar59 = (*(float *)(uVar11 + 0x4c) * fStack_102c +
                   fStack_ffc * fStack_103c +
                   *(float *)(uVar11 + 0xac) * fVar108 + *(float *)(uVar11 + 0xdc)) * -fVar44;
          fVar84 = fVar84 + fVar69;
          fVar91 = fVar91 + fVar74;
          fVar92 = fVar92 + fVar77;
          fVar104 = fVar104 + fVar80;
          fVar95 = fVar95 + fVar60;
          fVar98 = fVar98 + fVar64;
          fVar99 = fVar99 + fVar65;
          fVar100 = fVar100 + fVar66;
          fVar20 = fVar20 + fVar48;
          fVar39 = fVar39 + fVar53;
          fVar42 = fVar42 + fVar56;
          fVar44 = fVar44 + fVar59;
          auVar81._0_4_ =
               (uint)((int)fVar95 < (int)fVar60) * (int)fVar95 |
               (uint)((int)fVar95 >= (int)fVar60) * (int)fVar60;
          auVar81._4_4_ =
               (uint)((int)fVar98 < (int)fVar64) * (int)fVar98 |
               (uint)((int)fVar98 >= (int)fVar64) * (int)fVar64;
          auVar81._8_4_ =
               (uint)((int)fVar99 < (int)fVar65) * (int)fVar99 |
               (uint)((int)fVar99 >= (int)fVar65) * (int)fVar65;
          auVar81._12_4_ =
               (uint)((int)fVar100 < (int)fVar66) * (int)fVar100 |
               (uint)((int)fVar100 >= (int)fVar66) * (int)fVar66;
          auVar87._0_4_ =
               (uint)((int)fVar20 < (int)fVar48) * (int)fVar20 |
               (uint)((int)fVar20 >= (int)fVar48) * (int)fVar48;
          auVar87._4_4_ =
               (uint)((int)fVar39 < (int)fVar53) * (int)fVar39 |
               (uint)((int)fVar39 >= (int)fVar53) * (int)fVar53;
          auVar87._8_4_ =
               (uint)((int)fVar42 < (int)fVar56) * (int)fVar42 |
               (uint)((int)fVar42 >= (int)fVar56) * (int)fVar56;
          auVar87._12_4_ =
               (uint)((int)fVar44 < (int)fVar59) * (int)fVar44 |
               (uint)((int)fVar44 >= (int)fVar59) * (int)fVar59;
          auVar61 = maxps(auVar81,auVar87);
          auVar88._0_4_ =
               (uint)((int)fVar84 < (int)fVar69) * (int)fVar84 |
               (uint)((int)fVar84 >= (int)fVar69) * (int)fVar69;
          auVar88._4_4_ =
               (uint)((int)fVar91 < (int)fVar74) * (int)fVar91 |
               (uint)((int)fVar91 >= (int)fVar74) * (int)fVar74;
          auVar88._8_4_ =
               (uint)((int)fVar92 < (int)fVar77) * (int)fVar92 |
               (uint)((int)fVar92 >= (int)fVar77) * (int)fVar77;
          auVar88._12_4_ =
               (uint)((int)fVar104 < (int)fVar80) * (int)fVar104 |
               (uint)((int)fVar104 >= (int)fVar80) * (int)fVar80;
          auVar29._0_4_ =
               (uint)((int)fVar84 < (int)fVar69) * (int)fVar69 |
               (uint)((int)fVar84 >= (int)fVar69) * (int)fVar84;
          auVar29._4_4_ =
               (uint)((int)fVar91 < (int)fVar74) * (int)fVar74 |
               (uint)((int)fVar91 >= (int)fVar74) * (int)fVar91;
          auVar29._8_4_ =
               (uint)((int)fVar92 < (int)fVar77) * (int)fVar77 |
               (uint)((int)fVar92 >= (int)fVar77) * (int)fVar92;
          auVar29._12_4_ =
               (uint)((int)fVar104 < (int)fVar80) * (int)fVar80 |
               (uint)((int)fVar104 >= (int)fVar80) * (int)fVar104;
          auVar97._0_4_ =
               (uint)((int)fVar95 < (int)fVar60) * (int)fVar60 |
               (uint)((int)fVar95 >= (int)fVar60) * (int)fVar95;
          auVar97._4_4_ =
               (uint)((int)fVar98 < (int)fVar64) * (int)fVar64 |
               (uint)((int)fVar98 >= (int)fVar64) * (int)fVar98;
          auVar97._8_4_ =
               (uint)((int)fVar99 < (int)fVar65) * (int)fVar65 |
               (uint)((int)fVar99 >= (int)fVar65) * (int)fVar99;
          auVar97._12_4_ =
               (uint)((int)fVar100 < (int)fVar66) * (int)fVar66 |
               (uint)((int)fVar100 >= (int)fVar66) * (int)fVar100;
          auVar102._0_4_ =
               (uint)((int)fVar20 < (int)fVar48) * (int)fVar48 |
               (uint)((int)fVar20 >= (int)fVar48) * (int)fVar20;
          auVar102._4_4_ =
               (uint)((int)fVar39 < (int)fVar53) * (int)fVar53 |
               (uint)((int)fVar39 >= (int)fVar53) * (int)fVar39;
          auVar102._8_4_ =
               (uint)((int)fVar42 < (int)fVar56) * (int)fVar56 |
               (uint)((int)fVar42 >= (int)fVar56) * (int)fVar42;
          auVar102._12_4_ =
               (uint)((int)fVar44 < (int)fVar59) * (int)fVar59 |
               (uint)((int)fVar44 >= (int)fVar59) * (int)fVar44;
          auVar23 = minps(auVar97,auVar102);
          auVar22 = maxps(local_1018,auVar88);
          local_1098 = maxps(auVar22,auVar61);
          auVar62._4_4_ = fVar18;
          auVar62._0_4_ = fVar38;
          auVar62._8_4_ = fVar19;
          auVar62._12_4_ = fVar41;
          auVar22 = minps(auVar62,auVar29);
          auVar22 = minps(auVar22,auVar23);
          auVar49._4_4_ = -(uint)(local_1098._4_4_ <= auVar22._4_4_);
          auVar49._0_4_ = -(uint)(local_1098._0_4_ <= auVar22._0_4_);
          auVar49._8_4_ = -(uint)(local_1098._8_4_ <= auVar22._8_4_);
          auVar49._12_4_ = -(uint)(local_1098._12_4_ <= auVar22._12_4_);
          uVar9 = movmskps((int)context,auVar49);
          context = (RayQueryContext *)CONCAT44((int)((ulong)context >> 0x20),uVar9);
          auVar22 = local_1018;
          fVar84 = local_1058;
          fVar91 = fStack_1054;
          fVar92 = fStack_1050;
          fVar104 = fStack_104c;
          fVar48 = local_1028;
          fVar53 = fStack_1024;
          fVar56 = fStack_1020;
          fVar59 = fStack_101c;
          fVar60 = local_1048;
          fVar64 = fStack_1044;
          fVar65 = fStack_1040;
          fVar66 = fStack_103c;
          fVar69 = local_1038;
          fVar74 = fStack_1034;
          fVar77 = fStack_1030;
          fVar80 = fStack_102c;
          fVar95 = local_1068;
          fVar98 = fStack_1064;
          fVar99 = fStack_1060;
          fVar100 = fStack_105c;
        }
        if (context == (RayQueryContext *)0x0) goto LAB_0067a608;
        uVar11 = uVar10 & 0xfffffffffffffff0;
        lVar5 = 0;
        if (context != (RayQueryContext *)0x0) {
          for (; ((ulong)context >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
          }
        }
        uVar10 = *(ulong *)(uVar11 + lVar5 * 8);
        uVar21 = (uint)context - 1 & (uint)context;
        if (uVar21 != 0) {
          uVar40 = *(uint *)(local_1098 + lVar5 * 4);
          lVar5 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
            }
          }
          uVar3 = *(ulong *)(uVar11 + lVar5 * 8);
          uVar43 = *(uint *)(local_1098 + lVar5 * 4);
          uVar21 = uVar21 - 1 & uVar21;
          context = (RayQueryContext *)(ulong)uVar21;
          if (uVar21 == 0) {
            if (uVar40 < uVar43) {
              *(ulong *)*pauVar14 = uVar3;
              *(uint *)((long)*pauVar14 + 8) = uVar43;
              pauVar14 = pauVar14 + 1;
            }
            else {
              *(ulong *)*pauVar14 = uVar10;
              *(uint *)((long)*pauVar14 + 8) = uVar40;
              uVar10 = uVar3;
              pauVar14 = pauVar14 + 1;
            }
          }
          else {
            auVar50._8_4_ = uVar40;
            auVar50._0_8_ = uVar10;
            auVar50._12_4_ = 0;
            auVar70._8_4_ = uVar43;
            auVar70._0_8_ = uVar3;
            auVar70._12_4_ = 0;
            lVar5 = 0;
            if (context != (RayQueryContext *)0x0) {
              for (; (uVar21 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            uVar4 = *(undefined8 *)(uVar11 + lVar5 * 8);
            iVar17 = *(int *)(local_1098 + lVar5 * 4);
            auVar63._8_4_ = iVar17;
            auVar63._0_8_ = uVar4;
            auVar63._12_4_ = 0;
            auVar30._8_4_ = -(uint)((int)uVar40 < (int)uVar43);
            uVar21 = uVar21 - 1 & uVar21;
            if (uVar21 == 0) {
              auVar30._4_4_ = auVar30._8_4_;
              auVar30._0_4_ = auVar30._8_4_;
              auVar30._12_4_ = auVar30._8_4_;
              auVar82._8_4_ = uVar43;
              auVar82._0_8_ = uVar3;
              auVar82._12_4_ = 0;
              auVar23 = blendvps(auVar82,auVar50,auVar30);
              auVar61 = blendvps(auVar50,auVar70,auVar30);
              auVar31._8_4_ = -(uint)(auVar23._8_4_ < iVar17);
              auVar31._4_4_ = auVar31._8_4_;
              auVar31._0_4_ = auVar31._8_4_;
              auVar31._12_4_ = auVar31._8_4_;
              auVar71._8_4_ = iVar17;
              auVar71._0_8_ = uVar4;
              auVar71._12_4_ = 0;
              auVar94 = blendvps(auVar71,auVar23,auVar31);
              auVar83 = blendvps(auVar23,auVar63,auVar31);
              auVar32._8_4_ = -(uint)(auVar61._8_4_ < auVar83._8_4_);
              auVar32._4_4_ = auVar32._8_4_;
              auVar32._0_4_ = auVar32._8_4_;
              auVar32._12_4_ = auVar32._8_4_;
              auVar23 = blendvps(auVar83,auVar61,auVar32);
              auVar61 = blendvps(auVar61,auVar83,auVar32);
              *pauVar14 = auVar61;
              pauVar14[1] = auVar23;
              uVar10 = auVar94._0_8_;
              pauVar14 = pauVar14 + 2;
            }
            else {
              lVar5 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                }
              }
              auVar33._4_4_ = auVar30._8_4_;
              auVar33._0_4_ = auVar30._8_4_;
              auVar33._8_4_ = auVar30._8_4_;
              auVar33._12_4_ = auVar30._8_4_;
              auVar83 = blendvps(auVar70,auVar50,auVar33);
              auVar61 = blendvps(auVar50,auVar70,auVar33);
              auVar89._8_4_ = *(int *)(local_1098 + lVar5 * 4);
              auVar89._0_8_ = *(undefined8 *)(uVar11 + lVar5 * 8);
              auVar89._12_4_ = 0;
              auVar34._8_4_ = -(uint)(iVar17 < *(int *)(local_1098 + lVar5 * 4));
              auVar34._4_4_ = auVar34._8_4_;
              auVar34._0_4_ = auVar34._8_4_;
              auVar34._12_4_ = auVar34._8_4_;
              auVar94 = blendvps(auVar89,auVar63,auVar34);
              auVar23 = blendvps(auVar63,auVar89,auVar34);
              auVar35._8_4_ = -(uint)(auVar61._8_4_ < auVar23._8_4_);
              auVar35._4_4_ = auVar35._8_4_;
              auVar35._0_4_ = auVar35._8_4_;
              auVar35._12_4_ = auVar35._8_4_;
              auVar90 = blendvps(auVar23,auVar61,auVar35);
              auVar61 = blendvps(auVar61,auVar23,auVar35);
              auVar36._8_4_ = -(uint)(auVar83._8_4_ < auVar94._8_4_);
              auVar36._4_4_ = auVar36._8_4_;
              auVar36._0_4_ = auVar36._8_4_;
              auVar36._12_4_ = auVar36._8_4_;
              auVar23 = blendvps(auVar94,auVar83,auVar36);
              auVar83 = blendvps(auVar83,auVar94,auVar36);
              auVar37._8_4_ = -(uint)(auVar83._8_4_ < auVar90._8_4_);
              auVar37._4_4_ = auVar37._8_4_;
              auVar37._0_4_ = auVar37._8_4_;
              auVar37._12_4_ = auVar37._8_4_;
              auVar94 = blendvps(auVar90,auVar83,auVar37);
              auVar83 = blendvps(auVar83,auVar90,auVar37);
              *pauVar14 = auVar61;
              pauVar14[1] = auVar83;
              pauVar14[2] = auVar94;
              uVar10 = auVar23._0_8_;
              pauVar14 = pauVar14 + 3;
            }
          }
        }
        goto LAB_0067a62d;
      }
      goto LAB_0067a608;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }